

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_hlsl_add_vertex_attribute_remap
          (spvc_compiler compiler,spvc_hlsl_vertex_attribute_remap *remap,size_t count)

{
  CompilerHLSL *this;
  char *__s;
  spvc_context this_00;
  size_type sVar1;
  spvc_result sVar2;
  char **ppcVar3;
  HLSLVertexAttributeRemap re;
  HLSLVertexAttributeRemap local_78;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    local_78.semantic._M_dataplus._M_p = (pointer)&local_78.semantic.field_2;
    local_78.semantic._M_string_length = 0;
    local_78.semantic.field_2._M_local_buf[0] = '\0';
    if (count != 0) {
      this = (CompilerHLSL *)
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      ppcVar3 = &remap->semantic;
      do {
        sVar1 = local_78.semantic._M_string_length;
        local_78.location = ((spvc_hlsl_vertex_attribute_remap *)(ppcVar3 + -1))->location;
        __s = *ppcVar3;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_78.semantic,0,(char *)sVar1,(ulong)__s);
        spirv_cross::CompilerHLSL::add_vertex_attribute_remap(this,&local_78);
        ppcVar3 = ppcVar3 + 2;
        count = count - 1;
      } while (count != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.semantic._M_dataplus._M_p != &local_78.semantic.field_2) {
        operator_delete(local_78.semantic._M_dataplus._M_p);
      }
    }
    sVar2 = SPVC_SUCCESS;
  }
  else {
    this_00 = compiler->context;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"HLSL function used on a non-HLSL backend.","");
    std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
    if (this_00->callback != (spvc_error_callback)0x0) {
      (*this_00->callback)(this_00->callback_userdata,(this_00->last_error)._M_dataplus._M_p);
    }
    sVar2 = SPVC_ERROR_INVALID_ARGUMENT;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return sVar2;
}

Assistant:

spvc_result spvc_compiler_hlsl_add_vertex_attribute_remap(spvc_compiler compiler,
                                                          const spvc_hlsl_vertex_attribute_remap *remap,
                                                          size_t count)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	HLSLVertexAttributeRemap re;
	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	for (size_t i = 0; i < count; i++)
	{
		re.location = remap[i].location;
		re.semantic = remap[i].semantic;
		hlsl.add_vertex_attribute_remap(re);
	}

	return SPVC_SUCCESS;
#else
	(void)remap;
	(void)count;
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}